

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzAddMod_fast(word *c,word *a,word *b,word *mod,size_t n)

{
  int iVar1;
  word wVar2;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  size_t in_R8;
  
  wVar2 = zzAdd(in_RDI,in_RSI,in_RDX,in_R8);
  if ((wVar2 == 0) && (iVar1 = wwCmp_fast(in_RDI,in_RCX,in_R8), iVar1 < 0)) {
    return;
  }
  zzSub2(in_RDI,in_RCX,in_R8);
  return;
}

Assistant:

void FAST(zzAddMod)(word c[], const word a[], const word b[], const word mod[],
	size_t n)
{
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	ASSERT(wwIsDisjoint(c, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmp(b, mod, n) < 0);
	if (zzAdd(c, a, b, n) || FAST(wwCmp)(c, mod, n) >= 0)
		zzSub2(c, mod, n);
}